

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_option.hpp
# Opt level: O1

void __thiscall
duckdb::CSVOption<duckdb::StrpTimeFormat>::CSVOption
          (CSVOption<duckdb::StrpTimeFormat> *this,CSVOption<duckdb::StrpTimeFormat> *param_1)

{
  pointer pcVar1;
  
  this->set_by_user = param_1->set_by_user;
  (this->value).super_StrTimeFormat._vptr_StrTimeFormat = (_func_int **)&PTR__StrTimeFormat_024942f0
  ;
  (this->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p =
       (pointer)&(this->value).super_StrTimeFormat.format_specifier.field_2;
  pcVar1 = (param_1->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->value).super_StrTimeFormat.format_specifier,pcVar1,
             pcVar1 + (param_1->value).super_StrTimeFormat.format_specifier._M_string_length);
  ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::vector
            (&(this->value).super_StrTimeFormat.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>,
             &(param_1->value).super_StrTimeFormat.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(this->value).super_StrTimeFormat.literals,
           &(param_1->value).super_StrTimeFormat.literals.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  (this->value).super_StrTimeFormat.constant_size =
       (param_1->value).super_StrTimeFormat.constant_size;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&(this->value).super_StrTimeFormat.numeric_width.
              super_vector<int,_std::allocator<int>_>,
             &(param_1->value).super_StrTimeFormat.numeric_width.
              super_vector<int,_std::allocator<int>_>);
  (this->value).super_StrTimeFormat._vptr_StrTimeFormat = (_func_int **)&PTR__StrTimeFormat_02494368
  ;
  return;
}

Assistant:

CSVOption(T value_p) : value(value_p) { // NOLINT: allow implicit conversion from value
	}